

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug_p.h
# Opt level: O3

void QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>
               (QDebug *debug,char *prefix,QFlags<Qt::KeyboardModifier> *value)

{
  QTextStream *this;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QDebugStateSaver saver;
  QArrayData *local_58;
  undefined8 *local_50;
  Latin1Content local_48;
  undefined1 *local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)prefix != 0) {
    this = (QTextStream *)debug->stream;
    QVar1.m_data = (storage_type *)0x2;
    QVar1.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar1);
    QTextStream::operator<<(this,(QString *)&local_58);
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,2,0x10);
      }
    }
    if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)debug->stream,' ');
    }
    QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
    local_38 = QMetaObject::enumerator(0x832328);
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_40,debug);
    debug->stream[0x31] = (Stream)0x1;
    QMetaEnum::valueToKeys((ulonglong)&local_58);
    if (local_50 == (undefined8 *)0x0) {
      local_50 = &QByteArray::_empty;
    }
    QDebug::putByteArray((char *)debug,(ulong)local_50,local_48);
    if (((QTextStream *)debug->stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)debug->stream,' ');
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,1,0x10);
      }
    }
    QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void formatNonNullQFlags(QDebug &debug, const char *prefix, const QFlags<Enum> &value)
{
    if (value) {
        debug << prefix;
        formatQFlags(debug, value);
    }
}